

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

string * __thiscall
soplex::SLUFactor<double>::statistics_abi_cxx11_
          (string *__return_storage_ptr__,SLUFactor<double> *this)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  stringstream s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"Factorizations     : ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 10;
  iVar2 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[0xb])(this);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"  Time spent       : ");
  lVar1 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 10;
  *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 2;
  (*((this->super_CLUFactor<double>).factorTime)->_vptr_Timer[6])();
  poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"Solves             : ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 10;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->solveCount);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"  Time spent       : ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 10;
  (*this->solveTime->_vptr_Timer[6])();
  poVar3 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string SLUFactor<R>::statistics() const
{
   std::stringstream s;
   s  << "Factorizations     : " << std::setw(10) << getFactorCount() << std::endl
      << "  Time spent       : " << std::setw(10) << std::fixed << std::setprecision(
         2) << getFactorTime() << std::endl
      << "Solves             : " << std::setw(10) << getSolveCount() << std::endl
      << "  Time spent       : " << std::setw(10) << getSolveTime() << std::endl;

   return s.str();
}